

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

void __thiscall
wasm::PrintExpressionContents::visitStructNew(PrintExpressionContents *this,StructNew *curr)

{
  bool bVar1;
  HeapType type;
  TypeNamePrinter local_70;
  StructNew *local_18;
  StructNew *curr_local;
  PrintExpressionContents *this_local;
  
  local_18 = curr;
  curr_local = (StructNew *)this;
  bVar1 = printUnreachableReplacement(this,(Expression *)curr);
  if (!bVar1) {
    printMedium(this->o,"struct.new");
    bVar1 = StructNew::isWithDefault(local_18);
    if (bVar1) {
      printMedium(this->o,"_default");
    }
    std::operator<<(this->o,' ');
    anon_unknown_217::TypeNamePrinter::TypeNamePrinter(&local_70,this->o,this->wasm);
    type = wasm::Type::getHeapType
                     (&(local_18->super_SpecificExpression<(wasm::Expression::Id)60>).
                       super_Expression.type);
    anon_unknown_217::TypeNamePrinter::print(&local_70,type);
    anon_unknown_217::TypeNamePrinter::~TypeNamePrinter(&local_70);
  }
  return;
}

Assistant:

void visitStructNew(StructNew* curr) {
    if (printUnreachableReplacement(curr)) {
      return;
    }
    printMedium(o, "struct.new");
    if (curr->isWithDefault()) {
      printMedium(o, "_default");
    }
    o << ' ';
    TypeNamePrinter(o, wasm).print(curr->type.getHeapType());
  }